

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_22460c::BNTest_RSAZABI_Test::TestBody(BNTest_RSAZABI_Test *this)

{
  Type_conflict args_3;
  bool bVar1;
  int iVar2;
  BIGNUM *__p;
  char *pcVar3;
  pointer pbVar4;
  BN_MONT_CTX *__p_00;
  pointer pbVar5;
  char *in_R9;
  BN_ULONG k;
  AssertionResult gtest_ar__2;
  UniquePtr<BN_MONT_CTX> mont;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> n;
  BN_ULONG n_norm [16];
  BN_ULONG norm [16];
  BN_ULONG n_rsaz [40];
  BN_ULONG rsaz3 [40];
  BN_ULONG rsaz2 [40];
  BN_ULONG rsaz1 [40];
  BN_ULONG table [576];
  string local_1970;
  AssertHelper local_1950;
  Message local_1948;
  AssertionResult local_1940;
  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> local_1930;
  string local_1928;
  AssertHelper local_1908;
  Message local_1900;
  int local_18f4;
  AssertionResult local_18f0;
  uint local_18dc;
  string local_18d8;
  AssertHelper local_18b8;
  Message local_18b0 [3];
  AssertionResult local_1898;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_1888;
  BN_ULONG local_1880 [16];
  unsigned_long local_1800 [16];
  unsigned_long local_1780 [40];
  unsigned_long local_1640 [40];
  unsigned_long local_1500 [40];
  unsigned_long local_13c0 [40];
  unsigned_long local_1280 [591];
  
  iVar2 = rsaz_avx2_capable();
  if (iVar2 != 0) {
    memset(local_1280,0,0x1200);
    ::OPENSSL_memset(local_1800,0x42,0x80);
    ::OPENSSL_memset(local_1880,0x99,0x80);
    __p = BN_new();
    std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_1888,(pointer)__p);
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              (&local_1898,&local_1888,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1898);
    if (!bVar1) {
      testing::Message::Message(local_18b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_18d8,(internal *)&local_1898,(AssertionResult *)0x8f5f67,"false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_18b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0xb7d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_18b8,local_18b0);
      testing::internal::AssertHelper::~AssertHelper(&local_18b8);
      std::__cxx11::string::~string((string *)&local_18d8);
      testing::Message::~Message(local_18b0);
    }
    local_18dc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult(&local_1898);
    if (local_18dc == 0) {
      pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_1888);
      local_18f4 = bn_set_words(pbVar4,local_1880,0x10);
      testing::AssertionResult::AssertionResult<int>(&local_18f0,&local_18f4,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18f0);
      if (!bVar1) {
        testing::Message::Message(&local_1900);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1928,(internal *)&local_18f0,
                   (AssertionResult *)"bn_set_words(n.get(), n_norm, 16)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1908,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb7e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1908,&local_1900);
        testing::internal::AssertHelper::~AssertHelper(&local_1908);
        std::__cxx11::string::~string((string *)&local_1928);
        testing::Message::~Message(&local_1900);
      }
      local_18dc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult(&local_18f0);
      if (local_18dc == 0) {
        pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_1888);
        __p_00 = BN_MONT_CTX_new_for_modulus(pbVar4,(BN_CTX *)0x0);
        std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter> *)&local_1930,__p_00);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>>
                  (&local_1940,&local_1930,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1940);
        if (!bVar1) {
          testing::Message::Message(&local_1948);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_1970,(internal *)&local_1940,(AssertionResult *)0x86ceb4,"false","true",
                     in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1950,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb81,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1950,&local_1948);
          testing::internal::AssertHelper::~AssertHelper(&local_1950);
          std::__cxx11::string::~string((string *)&local_1970);
          testing::Message::~Message(&local_1948);
        }
        local_18dc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult(&local_1940);
        if (local_18dc == 0) {
          pbVar5 = std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::operator->(&local_1930)
          ;
          args_3 = pbVar5->n0[0];
          abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                    ("rsaz_1024_norm2red_avx2, rsaz1, norm",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb84,true,rsaz_1024_norm2red_avx2,local_13c0,local_1800);
          abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                    ("rsaz_1024_norm2red_avx2, n_rsaz, n_norm",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb85,true,rsaz_1024_norm2red_avx2,local_1780,local_1880);
          abi_test::internal::
          CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long,int>
                    ("rsaz_1024_sqr_avx2, rsaz2, rsaz1, n_rsaz, k, 1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb86,true,rsaz_1024_sqr_avx2,local_1500,local_13c0,local_1780,args_3,1);
          abi_test::internal::
          CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long,int>
                    ("rsaz_1024_sqr_avx2, rsaz3, rsaz2, n_rsaz, k, 4",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb87,true,rsaz_1024_sqr_avx2,local_1640,local_1500,local_1780,args_3,4);
          abi_test::internal::
          CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long_const*,unsigned_long>
                    ("rsaz_1024_mul_avx2, rsaz3, rsaz1, rsaz2, n_rsaz, k",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb88,true,rsaz_1024_mul_avx2,local_1640,local_13c0,local_1500,local_1780,
                     args_3);
          abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*,int>
                    ("rsaz_1024_scatter5_avx2, table, rsaz3, 7",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb89,true,rsaz_1024_scatter5_avx2,local_1280,local_1640,7);
          abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*,int>
                    ("rsaz_1024_gather5_avx2, rsaz1, table, 7",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb8a,true,rsaz_1024_gather5_avx2,local_13c0,local_1280,7);
          abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                    ("rsaz_1024_red2norm_avx2, norm, rsaz1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0xb8b,true,rsaz_1024_red2norm_avx2,local_1800,local_13c0);
          local_18dc = 0;
        }
        std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_1930);
      }
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_1888);
  }
  return;
}

Assistant:

TEST_F(BNTest, RSAZABI) {
  if (!rsaz_avx2_capable()) {
    return;
  }

  alignas(64) BN_ULONG table[32 * 18] = {0};
  alignas(64) BN_ULONG rsaz1[40], rsaz2[40], rsaz3[40], n_rsaz[40];
  BN_ULONG norm[16], n_norm[16];

  OPENSSL_memset(norm, 0x42, sizeof(norm));
  OPENSSL_memset(n_norm, 0x99, sizeof(n_norm));

  bssl::UniquePtr<BIGNUM> n(BN_new());
  ASSERT_TRUE(n);
  ASSERT_TRUE(bn_set_words(n.get(), n_norm, 16));
  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(n.get(), nullptr));
  ASSERT_TRUE(mont);
  const BN_ULONG k = mont->n0[0];

  CHECK_ABI(rsaz_1024_norm2red_avx2, rsaz1, norm);
  CHECK_ABI(rsaz_1024_norm2red_avx2, n_rsaz, n_norm);
  CHECK_ABI(rsaz_1024_sqr_avx2, rsaz2, rsaz1, n_rsaz, k, 1);
  CHECK_ABI(rsaz_1024_sqr_avx2, rsaz3, rsaz2, n_rsaz, k, 4);
  CHECK_ABI(rsaz_1024_mul_avx2, rsaz3, rsaz1, rsaz2, n_rsaz, k);
  CHECK_ABI(rsaz_1024_scatter5_avx2, table, rsaz3, 7);
  CHECK_ABI(rsaz_1024_gather5_avx2, rsaz1, table, 7);
  CHECK_ABI(rsaz_1024_red2norm_avx2, norm, rsaz1);
}